

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall
cashew::ValueBuilder::appendToObjectAsGetter(ValueBuilder *this,Ref array,IString key,Ref value)

{
  Value *this_00;
  bool bVar1;
  Ref *pRVar2;
  Ref RVar3;
  Ref RVar4;
  Ref r;
  Value *pVVar5;
  undefined1 local_40 [8];
  IString key_local;
  Ref array_local;
  
  key_local.str._M_len = key.str._M_len;
  local_40 = (undefined1  [8])array.inst;
  key_local.str._M_str = (char *)this;
  pRVar2 = Ref::operator[]((Ref *)&key_local.str._M_str,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)OBJECT);
  if (bVar1) {
    pRVar2 = Ref::operator[]((Ref *)&key_local.str._M_str,1);
    this_00 = pRVar2->inst;
    RVar3 = makeRawArray(2);
    RVar4 = makeRawArray(2);
    r = makeRawString((IString *)GETTER);
    pVVar5 = cashew::Value::push_back(RVar4.inst,r);
    RVar4 = makeRawString((IString *)local_40);
    RVar4.inst = cashew::Value::push_back(pVVar5,RVar4);
    pVVar5 = cashew::Value::push_back(RVar3.inst,RVar4);
    RVar3.inst = cashew::Value::push_back(pVVar5,(Value *)key.str._M_str);
    cashew::Value::push_back(this_00,RVar3);
    return;
  }
  __assert_fail("array[0] == OBJECT",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x738,"static void cashew::ValueBuilder::appendToObjectAsGetter(Ref, IString, Ref)"
               );
}

Assistant:

static void appendToObjectAsGetter(Ref array, IString key, Ref value) {
    assert(array[0] == OBJECT);
    array[1]->push_back(&makeRawArray(2)
                           ->push_back(&makeRawArray(2)
                                          ->push_back(makeRawString(GETTER))
                                          .push_back(makeRawString(key)))
                           .push_back(value));
  }